

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPxr24Compressor.cpp
# Opt level: O1

void __thiscall
Imf_2_5::Pxr24Compressor::Pxr24Compressor
          (Pxr24Compressor *this,Header *hdr,size_t maxScanLineSize,size_t numScanLines)

{
  int iVar1;
  ChannelList *pCVar2;
  unsigned_long a;
  unsigned_long uVar3;
  uchar *puVar4;
  char *pcVar5;
  Box2i *pBVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  Compressor::Compressor(&this->super_Compressor,hdr);
  (this->super_Compressor)._vptr_Compressor = (_func_int **)&PTR__Pxr24Compressor_0315fe78;
  this->_maxScanLineSize = (int)maxScanLineSize;
  this->_numScanLines = (int)numScanLines;
  this->_tmpBuffer = (uchar *)0x0;
  this->_outBuffer = (char *)0x0;
  pCVar2 = Header::channels(hdr);
  this->_channels = pCVar2;
  a = uiMult<unsigned_long>(maxScanLineSize,numScanLines);
  auVar8._8_4_ = (int)(a >> 0x20);
  auVar8._0_8_ = a;
  auVar8._12_4_ = 0x45300000;
  dVar7 = ceil(((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)a) - 4503599627370496.0)) * 0.01);
  uVar3 = uiAdd<unsigned_long>
                    (a,(long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7);
  uVar3 = uiAdd<unsigned_long>(uVar3,100);
  puVar4 = (uchar *)operator_new__(a);
  this->_tmpBuffer = puVar4;
  pcVar5 = (char *)operator_new__(uVar3);
  this->_outBuffer = pcVar5;
  pBVar6 = Header::dataWindow(hdr);
  this->_minX = (pBVar6->min).x;
  iVar1 = (pBVar6->max).y;
  this->_maxX = (pBVar6->max).x;
  this->_maxY = iVar1;
  return;
}

Assistant:

Pxr24Compressor::Pxr24Compressor (const Header &hdr,
				  size_t maxScanLineSize,
				  size_t numScanLines)
:
    Compressor (hdr),
    _maxScanLineSize (maxScanLineSize),
    _numScanLines (numScanLines),
    _tmpBuffer (0),
    _outBuffer (0),
    _channels (hdr.channels())
{
    size_t maxInBytes =
        uiMult (maxScanLineSize, numScanLines);

    size_t maxOutBytes =
        uiAdd (uiAdd (maxInBytes,
                      size_t (ceil (maxInBytes * 0.01))),
               size_t (100));

    _tmpBuffer = new unsigned char [maxInBytes];
    _outBuffer = new char [maxOutBytes];

    const Box2i &dataWindow = hdr.dataWindow();

    _minX = dataWindow.min.x;
    _maxX = dataWindow.max.x;
    _maxY = dataWindow.max.y;
}